

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

QList<QUrl> * __thiscall QFileDialog::selectedUrls(QFileDialog *this)

{
  long lVar1;
  bool bVar2;
  QFileDialogPrivate *this_00;
  const_iterator o;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QString *file;
  QStringList *__range2;
  QFileDialogPrivate *d;
  QList<QUrl> *urls;
  const_iterator __end2;
  const_iterator __begin2;
  QStringList selectedFileList;
  QList<QString> *this_01;
  QUrl in_stack_ffffffffffffffc0;
  const_iterator local_28;
  Data *local_20;
  QString *asize;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QFileDialog *)0x756991);
  if (((this_00->super_QDialogPrivate).nativeDialogInUse & 1U) == 0) {
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QUrl>::QList((QList<QUrl> *)0x7569e5);
    local_20 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    asize = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedFiles((QFileDialog *)in_stack_ffffffffffffffc0.d);
    QList<QString>::size((QList<QString> *)&local_20);
    QList<QUrl>::reserve((QList<QUrl> *)this_00,(qsizetype)asize);
    local_28.i = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QList<QString>::begin(this_01);
    o = QList<QString>::end(this_01);
    while (bVar2 = QList<QString>::const_iterator::operator!=(&local_28,o), bVar2) {
      QList<QString>::const_iterator::operator*(&local_28);
      QUrl::fromLocalFile((QString *)&stack0xffffffffffffffc0);
      QList<QUrl>::append((QList<QUrl> *)this_01,(rvalue_ref)in_RDI);
      QUrl::~QUrl((QUrl *)&stack0xffffffffffffffc0);
      QList<QString>::const_iterator::operator++(&local_28);
    }
    QList<QString>::~QList((QList<QString> *)0x756afc);
  }
  else {
    QFileDialogPrivate::userSelectedFiles((QFileDialogPrivate *)in_stack_ffffffffffffffc0.d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QUrl> *)this_01;
}

Assistant:

QList<QUrl> QFileDialog::selectedUrls() const
{
    Q_D(const QFileDialog);
    if (d->nativeDialogInUse) {
        return d->userSelectedFiles();
    } else {
        QList<QUrl> urls;
        const QStringList selectedFileList = selectedFiles();
        urls.reserve(selectedFileList.size());
        for (const QString &file : selectedFileList)
            urls.append(QUrl::fromLocalFile(file));
        return urls;
    }
}